

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  int iVar1;
  unsigned_long_long uVar2;
  int_type iVar3;
  int *piVar4;
  char *pcVar5;
  ulonglong uVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  longlong x_1;
  unsigned_long_long x;
  char *endptr;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *plStack_18;
  token_type number_type;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  plStack_18 = this;
  reset(this);
  endptr._4_4_ = 5;
  iVar1 = this->current;
  if (iVar1 == 0x2d) {
    add(this,this->current);
    endptr._4_4_ = 6;
    iVar3 = get(this);
    if (iVar3 != 0x30) {
      if (8 < iVar3 - 0x31U) {
        this->error_message = "invalid number; expected digit after \'-\'";
        return parse_error;
      }
      add(this,this->current);
      goto LAB_0021457b;
    }
    add(this,this->current);
  }
  else {
    if (iVar1 != 0x30) {
      if (8 < iVar1 - 0x31U) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                      ,0x1f71,
                      "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      add(this,this->current);
LAB_0021457b:
      do {
        iVar3 = get(this);
        switch(iVar3) {
        case 0x2e:
          goto switchD_002145a4_caseD_2e;
        default:
          goto LAB_00214737;
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          add(this,this->current);
          break;
        case 0x45:
        case 0x65:
          add(this,this->current);
          goto LAB_0021466e;
        }
      } while( true );
    }
    add(this,this->current);
  }
  iVar3 = get(this);
  if (iVar3 == 0x2e) {
    add(this,(int)this->decimal_point_char);
    goto LAB_002145dc;
  }
  if ((iVar3 != 0x45) && (iVar3 != 0x65)) goto LAB_00214737;
  add(this,this->current);
  goto LAB_0021466e;
switchD_002145a4_caseD_2e:
  add(this,(int)this->decimal_point_char);
LAB_002145dc:
  endptr._4_4_ = 7;
  iVar3 = get(this);
  if (9 < iVar3 - 0x30U) {
    this->error_message = "invalid number; expected digit after \'.\'";
    return parse_error;
  }
  add(this,this->current);
  while (iVar3 = get(this), iVar3 - 0x30U < 10) {
    add(this,this->current);
  }
  if ((iVar3 != 0x45) && (iVar3 != 0x65)) goto LAB_00214737;
  add(this,this->current);
LAB_0021466e:
  endptr._4_4_ = 7;
  iVar3 = get(this);
  if ((iVar3 == 0x2b) || (iVar3 == 0x2d)) {
    add(this,this->current);
    iVar3 = get(this);
    if (9 < iVar3 - 0x30U) {
      this->error_message = "invalid number; expected digit after exponent sign";
      return parse_error;
    }
    add(this,this->current);
  }
  else {
    if (9 < iVar3 - 0x30U) {
      this->error_message = "invalid number; expected \'+\', \'-\', or digit after exponent";
      return parse_error;
    }
    add(this,this->current);
  }
  while (iVar3 = get(this), iVar3 - 0x30U < 10) {
    add(this,this->current);
  }
LAB_00214737:
  unget(this);
  x = 0;
  piVar4 = __errno_location();
  *piVar4 = 0;
  if (endptr._4_4_ == 5) {
    pcVar5 = (char *)std::__cxx11::string::data();
    uVar6 = strtoull(pcVar5,(char **)&x,10);
    uVar2 = x;
    lVar7 = std::__cxx11::string::data();
    lVar8 = std::__cxx11::string::size();
    if (uVar2 != lVar7 + lVar8) {
      __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                    ,0x2068,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    piVar4 = __errno_location();
    if ((*piVar4 == 0) && (this->value_unsigned = uVar6, this->value_unsigned == uVar6)) {
      return value_unsigned;
    }
  }
  else if (endptr._4_4_ == 6) {
    pcVar5 = (char *)std::__cxx11::string::data();
    lVar9 = strtoll(pcVar5,(char **)&x,10);
    uVar2 = x;
    lVar7 = std::__cxx11::string::data();
    lVar8 = std::__cxx11::string::size();
    if (uVar2 != lVar7 + lVar8) {
      __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                    ,0x2078,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    piVar4 = __errno_location();
    if ((*piVar4 == 0) && (this->value_integer = lVar9, this->value_integer == lVar9)) {
      return value_integer;
    }
  }
  pcVar5 = (char *)std::__cxx11::string::data();
  strtof((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          *)&this->value_float,pcVar5,(char **)&x);
  uVar2 = x;
  lVar7 = std::__cxx11::string::data();
  lVar8 = std::__cxx11::string::size();
  if (uVar2 == lVar7 + lVar8) {
    return value_float;
  }
  __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                ,0x2089,
                "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                assert(false);  // LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr;
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        assert(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }